

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode Subscription_unregisterPublishJob(UA_Server *server,UA_Subscription *sub)

{
  if (sub->publishJobIsRegistered == true) {
    sub->publishJobIsRegistered = false;
    UA_Server_removeRepeatedJob(server,sub->publishJobGuid);
  }
  return 0;
}

Assistant:

UA_StatusCode
Subscription_unregisterPublishJob(UA_Server *server, UA_Subscription *sub) {
    if(!sub->publishJobIsRegistered)
        return UA_STATUSCODE_GOOD;
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Unregister subscription publishing callback",
                         sub->subscriptionID);
    sub->publishJobIsRegistered = false;
    return UA_Server_removeRepeatedJob(server, sub->publishJobGuid);
}